

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Auxiliary * fts5FindAuxiliary(Fts5FullTable *pTab,char *zName)

{
  int iVar1;
  Fts5Auxiliary *local_28;
  Fts5Auxiliary *pAux;
  char *zName_local;
  Fts5FullTable *pTab_local;
  
  local_28 = pTab->pGlobal->pAux;
  while( true ) {
    if (local_28 == (Fts5Auxiliary *)0x0) {
      return (Fts5Auxiliary *)0x0;
    }
    iVar1 = sqlite3_stricmp(zName,local_28->zFunc);
    if (iVar1 == 0) break;
    local_28 = local_28->pNext;
  }
  return local_28;
}

Assistant:

static Fts5Auxiliary *fts5FindAuxiliary(Fts5FullTable *pTab, const char *zName){
  Fts5Auxiliary *pAux;

  for(pAux=pTab->pGlobal->pAux; pAux; pAux=pAux->pNext){
    if( sqlite3_stricmp(zName, pAux->zFunc)==0 ) return pAux;
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}